

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void __thiscall vector_bagwell<int,_16U>::~vector_bagwell(vector_bagwell<int,_16U> *this)

{
  size_type sVar1;
  reference ppiVar2;
  undefined4 local_14;
  uint i;
  vector_bagwell<int,_16U> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<int_*,_std::allocator<int_*>_>::size(&this->_index_block);
    if (sVar1 <= local_14) break;
    ppiVar2 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        (&this->_index_block,(ulong)local_14);
    free(*ppiVar2);
    local_14 = local_14 + 1;
  }
  std::vector<int_*,_std::allocator<int_*>_>::~vector(&this->_index_block);
  return;
}

Assistant:

~vector_bagwell()
	{
		for (unsigned i=0; i < _index_block.size(); ++i)
			free(_index_block[i]);
	}